

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O0

RK_U32 mpp_has_more_rbsp_data(BitReadCtx_t *bitctx)

{
  MPP_RET MVar1;
  bool bVar2;
  BitReadCtx_t *bitctx_local;
  
  while( true ) {
    bVar2 = false;
    if (bitctx->bytes_left_ != 0) {
      bVar2 = bitctx->data_[bitctx->bytes_left_ - 1] == '\0';
    }
    if (!bVar2) break;
    bitctx->bytes_left_ = bitctx->bytes_left_ - 1;
  }
  if ((bitctx->num_remaining_bits_in_curr_byte_ == 0) &&
     (MVar1 = (*bitctx->update_curbyte)(bitctx), MVar1 != MPP_OK)) {
    return 0;
  }
  if (bitctx->bytes_left_ == 0) {
    if (bitctx->num_remaining_bits_in_curr_byte_ == 0) {
      bitctx_local._4_4_ = 0;
    }
    else {
      bitctx_local._4_4_ =
           (uint)((bitctx->curr_byte_ &
                  (long)((1 << ((char)bitctx->num_remaining_bits_in_curr_byte_ - 1U & 0x1f)) + -1))
                 != 0);
    }
  }
  else {
    bitctx_local._4_4_ = 1;
  }
  return bitctx_local._4_4_;
}

Assistant:

RK_U32 mpp_has_more_rbsp_data(BitReadCtx_t *bitctx)
{
    // remove tail byte which equal zero
    while (bitctx->bytes_left_ &&
           bitctx->data_[bitctx->bytes_left_ - 1] == 0)
        bitctx->bytes_left_--;

    // Make sure we have more bits, if we are at 0 bits in current byte
    // and updating current byte fails, we don't have more data anyway.
    if (bitctx->num_remaining_bits_in_curr_byte_ == 0 && bitctx->update_curbyte(bitctx))
        return 0;
    // On last byte?
    if (bitctx->bytes_left_)
        return 1;
    // Last byte, look for stop bit;
    // We have more RBSP data if the last non-zero bit we find is not the
    // first available bit.
    if (bitctx->num_remaining_bits_in_curr_byte_)
        return (bitctx->curr_byte_ &
                ((1 << (bitctx->num_remaining_bits_in_curr_byte_ - 1)) - 1)) != 0;
    else
        return 0;
}